

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Clara::CommandLine<Catch::ConfigData>::Arg::~Arg(Arg *this)

{
  Arg *this_local;
  
  OptionArgProperties::~OptionArgProperties(&this->super_OptionArgProperties);
  CommonArgProperties<Catch::ConfigData>::~CommonArgProperties
            (&this->super_CommonArgProperties<Catch::ConfigData>);
  return;
}

Assistant:

Arg(Detail::BoundArgFunction<ConfigT> const& _boundField) : CommonArgProperties<ConfigT>(_boundField) {}